

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_fm.hpp
# Opt level: O0

void __thiscall
ymfm::fm_engine_base<ymfm::opn_registers_base<true>_>::reset
          (fm_engine_base<ymfm::opn_registers_base<true>_> *this)

{
  pointer this_00;
  pointer this_01;
  size_t in_RCX;
  unique_ptr<ymfm::fm_operator<ymfm::opn_registers_base<true>_>,_std::default_delete<ymfm::fm_operator<ymfm::opn_registers_base<true>_>_>_>
  *op;
  unique_ptr<ymfm::fm_operator<ymfm::opn_registers_base<true>_>,_std::default_delete<ymfm::fm_operator<ymfm::opn_registers_base<true>_>_>_>
  *__end0_1;
  unique_ptr<ymfm::fm_operator<ymfm::opn_registers_base<true>_>,_std::default_delete<ymfm::fm_operator<ymfm::opn_registers_base<true>_>_>_>
  *__begin0_1;
  unique_ptr<ymfm::fm_operator<ymfm::opn_registers_base<true>_>,_std::default_delete<ymfm::fm_operator<ymfm::opn_registers_base<true>_>_>_>
  (*__range2_1) [24];
  unique_ptr<ymfm::fm_channel<ymfm::opn_registers_base<true>_>,_std::default_delete<ymfm::fm_channel<ymfm::opn_registers_base<true>_>_>_>
  *chan;
  unique_ptr<ymfm::fm_channel<ymfm::opn_registers_base<true>_>,_std::default_delete<ymfm::fm_channel<ymfm::opn_registers_base<true>_>_>_>
  *__end0;
  unique_ptr<ymfm::fm_channel<ymfm::opn_registers_base<true>_>,_std::default_delete<ymfm::fm_channel<ymfm::opn_registers_base<true>_>_>_>
  *__begin0;
  unique_ptr<ymfm::fm_channel<ymfm::opn_registers_base<true>_>,_std::default_delete<ymfm::fm_channel<ymfm::opn_registers_base<true>_>_>_>
  (*__range2) [6];
  fm_engine_base<ymfm::opn_registers_base<true>_>_conflict *this_local;
  
  set_reset_status(this,'\0',0xff);
  opn_registers_base<true>::reset(&this->m_regs);
  write(this,0x27,(void *)0x0,in_RCX);
  for (__end0 = this->m_channel;
      __end0 != (unique_ptr<ymfm::fm_channel<ymfm::opn_registers_base<true>_>,_std::default_delete<ymfm::fm_channel<ymfm::opn_registers_base<true>_>_>_>
                 *)this->m_operator; __end0 = __end0 + 1) {
    this_00 = std::
              unique_ptr<ymfm::fm_channel<ymfm::opn_registers_base<true>_>,_std::default_delete<ymfm::fm_channel<ymfm::opn_registers_base<true>_>_>_>
              ::operator->(__end0);
    fm_channel<ymfm::opn_registers_base<true>_>::reset(this_00);
  }
  for (__end0_1 = this->m_operator;
      (fm_engine_base<ymfm::opn_registers_base<true>_> *)__end0_1 != this + 1;
      __end0_1 = __end0_1 + 1) {
    this_01 = std::
              unique_ptr<ymfm::fm_operator<ymfm::opn_registers_base<true>_>,_std::default_delete<ymfm::fm_operator<ymfm::opn_registers_base<true>_>_>_>
              ::operator->(__end0_1);
    fm_operator<ymfm::opn_registers_base<true>_>::reset(this_01);
  }
  return;
}

Assistant:

void fm_engine_base<RegisterType>::reset()
{
	// reset all status bits
	set_reset_status(0, 0xff);

	// register type-specific initialization
	m_regs.reset();

	// explicitly write to the mode register since it has side-effects
	// QUESTION: old cores initialize this to 0x30 -- who is right?
	write(RegisterType::REG_MODE, 0);

	// reset the channels
	for (auto &chan : m_channel)
		chan->reset();

	// reset the operators
	for (auto &op : m_operator)
		op->reset();
}